

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

bool __thiscall asl::SocketServer::bindPath(SocketServer *this,String *sname)

{
  char cVar1;
  LocalSocket server;
  String local_30;
  
  LocalSocket::LocalSocket(&server);
  cVar1 = (**(code **)(*(long *)server.super_Socket.super_SmartObject._p + 0x38))
                    (server.super_Socket.super_SmartObject._p,sname);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)server.super_Socket.super_SmartObject._p + 0x80))(&local_30);
    String::operator=(&this->_socketError,&local_30);
    String::~String(&local_30);
  }
  else {
    (**(code **)(*(long *)server.super_Socket.super_SmartObject._p + 0x40))
              (server.super_Socket.super_SmartObject._p,5);
    Sockets::operator<<(&this->_sockets,&server.super_Socket);
  }
  SmartObject::~SmartObject((SmartObject *)&server);
  return (bool)cVar1;
}

Assistant:

bool SocketServer::bindPath(const String& sname)
{
#if !defined(_WIN32) || defined(ASL_SOCKET_LOCAL)
	LocalSocket server;
	if(server.bind(sname))
	{
		server.listen(5);
		_sockets << server;
		return true;
	}
	_socketError = server.errorMsg();
#else
	(void)sname;
	_socketError = "SOCKET_BAD_BIND";
#endif
	return false;
}